

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

qlonglong __thiscall ProString::toLongLong(ProString *this,bool *ok,int base)

{
  qint64 qVar1;
  undefined4 in_EDX;
  qsizetype in_RSI;
  bool *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff8c;
  QStringView *this_00;
  QStringView *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  bool *pos;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_18;
  pos = in_RDI;
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffffa0,(QString *)this_00);
  QStringView::mid((QStringView *)CONCAT44(in_EDX,in_stack_ffffffffffffffa8),(qsizetype)pos,in_RSI);
  qVar1 = QStringView::toLongLong(this_00,in_RDI,in_stack_ffffffffffffff8c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qlonglong toLongLong(bool *ok = nullptr, int base = 10) const { return toQStringView().toLongLong(ok, base); }